

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int stb_vorbis_get_samples_float_interleaved
              (stb_vorbis *f,int channels,float *buffer,int num_floats)

{
  int iVar1;
  int iVar2;
  int local_48;
  int local_44;
  int k;
  int j;
  int i;
  int z;
  int n;
  int len;
  float **outputs;
  float *pfStack_20;
  int num_floats_local;
  float *buffer_local;
  stb_vorbis *psStack_10;
  int channels_local;
  stb_vorbis *f_local;
  
  iVar1 = num_floats / channels;
  i = 0;
  j = f->channels;
  outputs._4_4_ = num_floats;
  pfStack_20 = buffer;
  buffer_local._4_4_ = channels;
  psStack_10 = f;
  if (channels < j) {
    j = channels;
  }
  while( true ) {
    if (iVar1 <= i) {
      return i;
    }
    local_48 = psStack_10->channel_buffer_end - psStack_10->channel_buffer_start;
    if (iVar1 <= i + local_48) {
      local_48 = iVar1 - i;
    }
    for (local_44 = 0; local_44 < local_48; local_44 = local_44 + 1) {
      for (k = 0; k < j; k = k + 1) {
        *pfStack_20 = psStack_10->channel_buffers[k][psStack_10->channel_buffer_start + local_44];
        pfStack_20 = pfStack_20 + 1;
      }
      for (; k < buffer_local._4_4_; k = k + 1) {
        *pfStack_20 = 0.0;
        pfStack_20 = pfStack_20 + 1;
      }
    }
    i = local_48 + i;
    psStack_10->channel_buffer_start = local_48 + psStack_10->channel_buffer_start;
    if (i == iVar1) break;
    iVar2 = stb_vorbis_get_frame_float(psStack_10,(int *)0x0,(float ***)&n);
    if (iVar2 == 0) {
      return i;
    }
  }
  return i;
}

Assistant:

int stb_vorbis_get_samples_float_interleaved(stb_vorbis *f, int channels, float *buffer, int num_floats)
{
   float **outputs;
   int len = num_floats / channels;
   int n=0;
   int z = f->channels;
   if (z > channels) z = channels;
   while (n < len) {
      int i,j;
      int k = f->channel_buffer_end - f->channel_buffer_start;
      if (n+k >= len) k = len - n;
      for (j=0; j < k; ++j) {
         for (i=0; i < z; ++i)
            *buffer++ = f->channel_buffers[i][f->channel_buffer_start+j];
         for (   ; i < channels; ++i)
            *buffer++ = 0;
      }
      n += k;
      f->channel_buffer_start += k;
      if (n == len)
         break;
      if (!stb_vorbis_get_frame_float(f, NULL, &outputs))
         break;
   }
   return n;
}